

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderBool
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,ProtoStreamObjectSource *os,
          Type *type,StringPiece field_name,ObjectWriter *ow)

{
  CodedInputStream *pCVar1;
  byte *pbVar2;
  uint8 *puVar3;
  uint32 uVar4;
  unsigned_long uVar5;
  bool bVar6;
  pair<unsigned_long,_bool> pVar7;
  
  pCVar1 = this->stream_;
  pbVar2 = pCVar1->buffer_;
  if (pbVar2 < pCVar1->buffer_end_) {
    uVar4 = (uint32)*pbVar2;
    if ((char)*pbVar2 < '\0') goto LAB_00323068;
    pCVar1->buffer_ = pbVar2 + 1;
  }
  else {
    uVar4 = 0;
LAB_00323068:
    uVar4 = io::CodedInputStream::ReadTagFallback(pCVar1,uVar4);
  }
  pCVar1->last_tag_ = uVar4;
  if (uVar4 == 0) {
    bVar6 = false;
    goto LAB_003230f1;
  }
  pCVar1 = this->stream_;
  puVar3 = pCVar1->buffer_;
  if ((puVar3 < pCVar1->buffer_end_) && (uVar5 = (unsigned_long)(char)*puVar3, -1 < (long)uVar5)) {
    pCVar1->buffer_ = puVar3 + 1;
  }
  else {
    pVar7 = io::CodedInputStream::ReadVarint64Fallback(pCVar1);
    uVar5 = pVar7.first;
  }
  pCVar1 = this->stream_;
  pbVar2 = pCVar1->buffer_;
  if (pbVar2 < pCVar1->buffer_end_) {
    uVar4 = (uint32)*pbVar2;
    if ((char)*pbVar2 < '\0') goto LAB_003230d6;
    pCVar1->buffer_ = pbVar2 + 1;
  }
  else {
    uVar4 = 0;
LAB_003230d6:
    uVar4 = io::CodedInputStream::ReadTagFallback(pCVar1,uVar4);
  }
  pCVar1->last_tag_ = uVar4;
  bVar6 = uVar5 != 0;
LAB_003230f1:
  (**(code **)(*(long *)field_name.length_ + 0x30))
            ((long *)field_name.length_,type,field_name.ptr_,bVar6);
  Status::Status(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::RenderBool(const ProtoStreamObjectSource* os,
                                           const google::protobuf::Type& type,
                                           StringPiece field_name,
                                           ObjectWriter* ow) {
  uint32 tag = os->stream_->ReadTag();
  uint64 buffer64 = 0;  // results in 'false' value as default, which is the
                        // default value of Bool wrapper
  if (tag != 0) {
    os->stream_->ReadVarint64(&buffer64);
    os->stream_->ReadTag();
  }
  ow->RenderBool(field_name, buffer64 != 0);
  return util::Status();
}